

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O0

bool __thiscall Torus::intersect(Torus *this,Ray *r,float tmin,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  float *pfVar7;
  undefined8 *puVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float extraout_XMM0_Da;
  float fVar14;
  double dVar15;
  undefined1 local_cc [8];
  Vector3f normal;
  float alpha;
  Vector3f point;
  int i;
  float imag_eps;
  float t_guess;
  float t_min;
  complex<double> solution;
  complex<double> *solutions;
  double d;
  double c;
  double b;
  double a;
  double z;
  float four_a_sqrd;
  float f;
  float e;
  float sum_d_sqrd;
  Vector3f ray_org;
  Vector3f ray_dir;
  Hit *h_local;
  float tmin_local;
  Ray *r_local;
  Torus *this_local;
  
  Ray::getDirection((Ray *)(ray_org.m_elements + 1));
  Ray::getOrigin((Ray *)&e);
  fVar9 = Vector3f::absSquared((Vector3f *)(ray_org.m_elements + 1));
  fVar10 = Vector3f::absSquared((Vector3f *)&e);
  fVar11 = -this->_R * this->_R + -this->_r * this->_r + fVar10;
  fVar12 = Vector3f::dot((Vector3f *)&e,(Vector3f *)(ray_org.m_elements + 1));
  fVar13 = this->_R * 4.0 * this->_R;
  dVar15 = (double)(fVar9 * fVar9);
  pfVar7 = Vector3f::operator[]((Vector3f *)(ray_org.m_elements + 1),1);
  fVar10 = *pfVar7;
  pfVar7 = Vector3f::operator[]((Vector3f *)(ray_org.m_elements + 1),1);
  fVar14 = *pfVar7;
  pfVar7 = Vector3f::operator[]((Vector3f *)(ray_org.m_elements + 1),1);
  fVar1 = *pfVar7;
  pfVar7 = Vector3f::operator[]((Vector3f *)&e,1);
  fVar2 = *pfVar7;
  fVar3 = this->_r;
  fVar4 = this->_r;
  pfVar7 = Vector3f::operator[]((Vector3f *)&e,1);
  fVar5 = *pfVar7;
  pfVar7 = Vector3f::operator[]((Vector3f *)&e,1);
  solution._M_value._8_8_ =
       solve_quartic(((double)fVar9 * 4.0 * (double)fVar12) / dVar15,
                     ((double)fVar9 * 2.0 * (double)fVar11 + (double)fVar12 * 4.0 * (double)fVar12 +
                     (double)(fVar13 * fVar10 * fVar14)) / dVar15,
                     ((double)fVar12 * 4.0 * (double)fVar11 +
                     (double)fVar13 * 2.0 * (double)fVar1 * (double)fVar2) / dVar15,
                     (double)(fVar11 * fVar11 + -(fVar13 * (fVar3 * fVar4 + -(fVar5 * *pfVar7)))) /
                     dVar15);
  std::complex<double>::complex((complex<double> *)&t_guess,0.0,0.0);
  imag_eps = Hit::getT(h);
  point.m_elements[2] = 0.0;
  for (point.m_elements[1] = 0.0; (int)point.m_elements[1] < 4;
      point.m_elements[1] = (float)((int)point.m_elements[1] + 1)) {
    puVar8 = (undefined8 *)(solution._M_value._8_8_ + (long)(int)point.m_elements[1] * 0x10);
    _t_guess = *puVar8;
    solution._M_value._0_8_ = puVar8[1];
    dVar15 = std::complex<double>::imag_abi_cxx11_((complex<double> *)&t_guess);
    iVar6 = (int)dVar15;
    if (iVar6 < 1) {
      iVar6 = -iVar6;
    }
    if ((float)iVar6 <= point.m_elements[2]) {
      dVar15 = std::complex<double>::real_abi_cxx11_((complex<double> *)&t_guess);
      fVar10 = (float)dVar15;
      if ((fVar10 < imag_eps) && (tmin < fVar10)) {
        imag_eps = fVar10;
      }
    }
  }
  fVar10 = Hit::getT(h);
  if (imag_eps < fVar10) {
    Ray::pointAtParameter((Ray *)&stack0xffffffffffffff4c,imag_eps);
    fVar14 = this->_R;
    iVar6 = (int)&stack0xffffffffffffff4c;
    Vector3f::xz((Vector3f *)(normal.m_elements + 1));
    Vector2f::abs((Vector2f *)(normal.m_elements + 1),iVar6);
    fVar14 = fVar14 / extraout_XMM0_Da;
    pfVar7 = Vector3f::operator[]((Vector3f *)&stack0xffffffffffffff4c,0);
    fVar1 = *pfVar7;
    pfVar7 = Vector3f::operator[]((Vector3f *)&stack0xffffffffffffff4c,1);
    fVar2 = *pfVar7;
    pfVar7 = Vector3f::operator[]((Vector3f *)&stack0xffffffffffffff4c,2);
    Vector3f::Vector3f((Vector3f *)local_cc,(1.0 - fVar14) * fVar1,fVar2,(1.0 - fVar14) * *pfVar7);
    Vector3f::normalize((Vector3f *)local_cc);
    Hit::set(h,imag_eps,(this->super_Object3D).material,(Vector3f *)local_cc);
  }
  return imag_eps < fVar10;
}

Assistant:

bool Torus::intersect(const Ray &r, float tmin, Hit &h) const {
    // method adapted from https://github.com/sasamil/Quartic
    // and http://www.cosinekitty.com/raytrace/chapter13_torus.html
    Vector3f ray_dir = r.getDirection();
    Vector3f ray_org = r.getOrigin();

    float sum_d_sqrd = ray_dir.absSquared();
    float e = ray_org.absSquared() - _r * _r - _R * _R;
    float f = Vector3f::dot(ray_org, ray_dir);
    float four_a_sqrd = 4.f * _R * _R;

    double z = sum_d_sqrd * sum_d_sqrd; // x^4
    double a = 4. * sum_d_sqrd * f; // x^3
    double b = 2. * sum_d_sqrd * e + 4. * f * f + four_a_sqrd * ray_dir[1] * ray_dir[1]; // x^2
    double c = 4. * f * e + 2. * four_a_sqrd * ray_dir[1] * ray_org[1];
    double d = e * e - four_a_sqrd * (_r * _r - ray_org[1] * ray_org[1]);

    a /= z;
    b /= z;
    c /= z;
    d /= z;

    std::complex<double> *solutions = solve_quartic(a, b, c, d);

    // find closest solution
    std::complex<double> solution;
    float t_min = h.getT();
    float t_guess;
    float imag_eps = 0.;
    for (int i = 0; i < 4; i++) {
        solution = solutions[i];

        if (abs(solution.imag()) > imag_eps) {
            continue;
        }

        t_guess = (float) solution.real();

        if ((t_guess < t_min) && (t_guess > tmin)) {
            t_min = t_guess;
        }
    }

    // check that it is the closest hit so far
    if (t_min < h.getT()) {
        Vector3f point = r.pointAtParameter(t_min);

        float alpha = _R / point.xz().abs();
        Vector3f normal((1 - alpha) * point[0], point[1], (1 - alpha) * point[2]);
        normal.normalize();

        h.set(t_min, this->material, normal);
        return true;
    }

    return false;
}